

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O0

int chirc_ctx_add_server(chirc_ctx_t *ctx,chirc_server_t *server)

{
  UT_hash_handle *pUVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  UT_hash_table *pUVar7;
  UT_hash_bucket *pUVar8;
  UT_hash_bucket *pUVar9;
  uint local_74;
  UT_hash_bucket *_he_newbkt;
  UT_hash_bucket *_he_new_buckets;
  UT_hash_handle *_he_hh_nxt;
  UT_hash_handle *_he_thh;
  uint _he_bkt_i;
  uint _he_bkt;
  UT_hash_bucket *_ha_head;
  byte *pbStack_30;
  uint _ha_bkt;
  uchar *_hj_key;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _ha_hashv;
  chirc_server_t *server_local;
  chirc_ctx_t *ctx_local;
  
  pbStack_30 = (byte *)server->servername;
  _hj_j = 0xfeedbeef;
  _hj_key._4_4_ = 0x9e3779b9;
  _hj_k = 0x9e3779b9;
  sVar6 = sdslen(server->servername);
  for (_hj_key._0_4_ = (uint)sVar6; 0xb < (uint)_hj_key; _hj_key._0_4_ = (uint)_hj_key - 0xc) {
    iVar2 = (uint)pbStack_30[4] + (uint)pbStack_30[5] * 0x100 + (uint)pbStack_30[6] * 0x10000 +
            (uint)pbStack_30[7] * 0x1000000 + _hj_key._4_4_;
    uVar3 = (uint)pbStack_30[8] + (uint)pbStack_30[9] * 0x100 + (uint)pbStack_30[10] * 0x10000 +
            (uint)pbStack_30[0xb] * 0x1000000 + _hj_j;
    uVar4 = uVar3 >> 0xd ^
            (((uint)*pbStack_30 + (uint)pbStack_30[1] * 0x100 + (uint)pbStack_30[2] * 0x10000 +
              (uint)pbStack_30[3] * 0x1000000 + _hj_k) - iVar2) - uVar3;
    uVar5 = uVar4 << 8 ^ (iVar2 - uVar3) - uVar4;
    uVar3 = uVar5 >> 0xd ^ (uVar3 - uVar4) - uVar5;
    uVar4 = uVar3 >> 0xc ^ (uVar4 - uVar5) - uVar3;
    uVar5 = uVar4 << 0x10 ^ (uVar5 - uVar3) - uVar4;
    uVar3 = uVar5 >> 5 ^ (uVar3 - uVar4) - uVar5;
    _hj_k = uVar3 >> 3 ^ (uVar4 - uVar5) - uVar3;
    _hj_key._4_4_ = _hj_k << 10 ^ (uVar5 - uVar3) - _hj_k;
    _hj_j = _hj_key._4_4_ >> 0xf ^ (uVar3 - _hj_k) - _hj_key._4_4_;
    pbStack_30 = pbStack_30 + 0xc;
  }
  sVar6 = sdslen(server->servername);
  _hj_j = _hj_j + (int)sVar6;
  switch((uint)_hj_key) {
  case 0xb:
    _hj_j = (uint)pbStack_30[10] * 0x1000000 + _hj_j;
  case 10:
    _hj_j = (uint)pbStack_30[9] * 0x10000 + _hj_j;
  case 9:
    _hj_j = (uint)pbStack_30[8] * 0x100 + _hj_j;
  case 8:
    _hj_key._4_4_ = (uint)pbStack_30[7] * 0x1000000 + _hj_key._4_4_;
  case 7:
    _hj_key._4_4_ = (uint)pbStack_30[6] * 0x10000 + _hj_key._4_4_;
  case 6:
    _hj_key._4_4_ = (uint)pbStack_30[5] * 0x100 + _hj_key._4_4_;
  case 5:
    _hj_key._4_4_ = pbStack_30[4] + _hj_key._4_4_;
  case 4:
    _hj_k = (uint)pbStack_30[3] * 0x1000000 + _hj_k;
  case 3:
    _hj_k = (uint)pbStack_30[2] * 0x10000 + _hj_k;
  case 2:
    _hj_k = (uint)pbStack_30[1] * 0x100 + _hj_k;
  case 1:
    _hj_k = *pbStack_30 + _hj_k;
  }
  uVar3 = _hj_j >> 0xd ^ (_hj_k - _hj_key._4_4_) - _hj_j;
  uVar4 = uVar3 << 8 ^ (_hj_key._4_4_ - _hj_j) - uVar3;
  uVar5 = uVar4 >> 0xd ^ (_hj_j - uVar3) - uVar4;
  uVar3 = uVar5 >> 0xc ^ (uVar3 - uVar4) - uVar5;
  uVar4 = uVar3 << 0x10 ^ (uVar4 - uVar5) - uVar3;
  uVar5 = uVar4 >> 5 ^ (uVar5 - uVar3) - uVar4;
  uVar3 = uVar5 >> 3 ^ (uVar3 - uVar4) - uVar5;
  uVar4 = uVar3 << 10 ^ (uVar4 - uVar5) - uVar3;
  uVar3 = uVar4 >> 0xf ^ (uVar5 - uVar3) - uVar4;
  (server->hh).hashv = uVar3;
  (server->hh).key = server->servername;
  sVar6 = sdslen(server->servername);
  (server->hh).keylen = (uint)sVar6;
  if ((ctx->network).servers == (chirc_server_t *)0x0) {
    (server->hh).next = (void *)0x0;
    (server->hh).prev = (void *)0x0;
    pUVar7 = (UT_hash_table *)malloc(0x40);
    (server->hh).tbl = pUVar7;
    if ((server->hh).tbl == (UT_hash_table *)0x0) {
      exit(-1);
    }
    memset((server->hh).tbl,0,0x40);
    ((server->hh).tbl)->tail = &server->hh;
    ((server->hh).tbl)->num_buckets = 0x20;
    ((server->hh).tbl)->log2_num_buckets = 5;
    ((server->hh).tbl)->hho = 0x30;
    pUVar8 = (UT_hash_bucket *)malloc(0x200);
    ((server->hh).tbl)->buckets = pUVar8;
    ((server->hh).tbl)->signature = 0xa0111fe1;
    if (((server->hh).tbl)->buckets == (UT_hash_bucket *)0x0) {
      exit(-1);
    }
    memset(((server->hh).tbl)->buckets,0,0x200);
    (ctx->network).servers = server;
  }
  else {
    (server->hh).tbl = (((ctx->network).servers)->hh).tbl;
    (server->hh).next = (void *)0x0;
    (server->hh).prev =
         (void *)((long)((((ctx->network).servers)->hh).tbl)->tail -
                 ((((ctx->network).servers)->hh).tbl)->hho);
    ((((ctx->network).servers)->hh).tbl)->tail->next = server;
    ((((ctx->network).servers)->hh).tbl)->tail = &server->hh;
  }
  pUVar7 = (((ctx->network).servers)->hh).tbl;
  pUVar7->num_items = pUVar7->num_items + 1;
  pUVar8 = ((((ctx->network).servers)->hh).tbl)->buckets +
           (uVar3 & ((((ctx->network).servers)->hh).tbl)->num_buckets - 1);
  pUVar8->count = pUVar8->count + 1;
  (server->hh).hh_next = pUVar8->hh_head;
  (server->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar8->hh_head != (UT_hash_handle *)0x0) {
    pUVar8->hh_head->hh_prev = &server->hh;
  }
  pUVar8->hh_head = &server->hh;
  if (((pUVar8->expand_mult + 1) * 10 <= pUVar8->count) && (((server->hh).tbl)->noexpand == 0)) {
    pUVar8 = (UT_hash_bucket *)malloc((ulong)((server->hh).tbl)->num_buckets << 5);
    if (pUVar8 == (UT_hash_bucket *)0x0) {
      exit(-1);
    }
    memset(pUVar8,0,(ulong)((server->hh).tbl)->num_buckets << 5);
    ((server->hh).tbl)->ideal_chain_maxlen =
         (((server->hh).tbl)->num_items >> ((char)((server->hh).tbl)->log2_num_buckets + 1U & 0x1f))
         + (uint)((((server->hh).tbl)->num_items & ((server->hh).tbl)->num_buckets * 2 - 1) != 0);
    ((server->hh).tbl)->nonideal_items = 0;
    for (_he_thh._0_4_ = 0; (uint)_he_thh < ((server->hh).tbl)->num_buckets;
        _he_thh._0_4_ = (uint)_he_thh + 1) {
      _he_hh_nxt = ((server->hh).tbl)->buckets[(uint)_he_thh].hh_head;
      while (_he_hh_nxt != (UT_hash_handle *)0x0) {
        pUVar1 = _he_hh_nxt->hh_next;
        pUVar9 = pUVar8 + (_he_hh_nxt->hashv & ((server->hh).tbl)->num_buckets * 2 - 1);
        uVar3 = pUVar9->count + 1;
        pUVar9->count = uVar3;
        if ((((server->hh).tbl)->ideal_chain_maxlen < uVar3) &&
           (pUVar7 = (server->hh).tbl, pUVar7->nonideal_items = pUVar7->nonideal_items + 1,
           pUVar9->expand_mult * ((server->hh).tbl)->ideal_chain_maxlen < pUVar9->count)) {
          pUVar9->expand_mult = pUVar9->expand_mult + 1;
        }
        _he_hh_nxt->hh_prev = (UT_hash_handle *)0x0;
        _he_hh_nxt->hh_next = pUVar9->hh_head;
        if (pUVar9->hh_head != (UT_hash_handle *)0x0) {
          pUVar9->hh_head->hh_prev = _he_hh_nxt;
        }
        pUVar9->hh_head = _he_hh_nxt;
        _he_hh_nxt = pUVar1;
      }
    }
    free(((server->hh).tbl)->buckets);
    pUVar7 = (server->hh).tbl;
    pUVar7->num_buckets = pUVar7->num_buckets << 1;
    pUVar7 = (server->hh).tbl;
    pUVar7->log2_num_buckets = pUVar7->log2_num_buckets + 1;
    ((server->hh).tbl)->buckets = pUVar8;
    if (((server->hh).tbl)->num_items >> 1 < ((server->hh).tbl)->nonideal_items) {
      local_74 = ((server->hh).tbl)->ineff_expands + 1;
    }
    else {
      local_74 = 0;
    }
    ((server->hh).tbl)->ineff_expands = local_74;
    if (1 < ((server->hh).tbl)->ineff_expands) {
      ((server->hh).tbl)->noexpand = 1;
    }
  }
  return 0;
}

Assistant:

int chirc_ctx_add_server(chirc_ctx_t *ctx, chirc_server_t *server)
{
    HASH_ADD_KEYPTR(hh, ctx->network.servers, server->servername, sdslen(server->servername), server);

    return CHIRC_OK;
}